

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O1

void __thiscall
libtorrent::url_seed_alert::url_seed_alert
          (url_seed_alert *this,stack_allocator *alloc,torrent_handle *h,string_view u,string_view m
          )

{
  allocation_slot aVar1;
  
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__url_seed_alert_00461830;
  (this->error).val_ = 0;
  (this->error).failed_ = false;
  (this->error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aVar1 = aux::stack_allocator::copy_string(alloc,u);
  (this->m_url_idx).m_idx = aVar1.m_idx;
  aVar1 = aux::stack_allocator::copy_string(alloc,m);
  (this->m_msg_idx).m_idx = aVar1.m_idx;
  (this->url)._M_dataplus._M_p = (pointer)&(this->url).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->url,u.ptr_,u.ptr_ + u.len_);
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->msg,m.ptr_,m.ptr_ + m.len_);
  return;
}

Assistant:

url_seed_alert::url_seed_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, string_view u, string_view m)
		: torrent_alert(alloc, h)
		, m_url_idx(alloc.copy_string(u))
		, m_msg_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, url(u)
		, msg(m)
#endif
	{}